

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O3

void duckdb::ReservoirQuantileOperation::Destroy<duckdb::ReservoirQuantileState<short>>
               (ReservoirQuantileState<short> *state,AggregateInputData *aggr_input_data)

{
  RandomEngine *this;
  
  if (state->v != (short *)0x0) {
    free(state->v);
    state->v = (short *)0x0;
  }
  this = (RandomEngine *)state->r_samp;
  if (this != (RandomEngine *)0x0) {
    if (*(void **)(this + 0x58) != (void *)0x0) {
      operator_delete(*(void **)(this + 0x58));
    }
    duckdb::RandomEngine::~RandomEngine(this);
    operator_delete(this);
    state->r_samp = (BaseReservoirSampling *)0x0;
  }
  return;
}

Assistant:

static void Destroy(STATE &state, AggregateInputData &aggr_input_data) {
		if (state.v) {
			free(state.v);
			state.v = nullptr;
		}
		if (state.r_samp) {
			delete state.r_samp;
			state.r_samp = nullptr;
		}
	}